

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

int Cof_ManSuppSize(Cof_Man_t *p,Cof_Obj_t **ppObjs,int nObjs)

{
  int iVar1;
  int iVar2;
  Cof_Obj_t *pObj;
  ulong uVar3;
  ulong uVar4;
  
  p->nTravIds = p->nTravIds + 1;
  uVar3 = 0;
  uVar4 = (ulong)(uint)nObjs;
  if (nObjs < 1) {
    uVar4 = uVar3;
  }
  iVar2 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pObj = ppObjs[uVar3];
    if (((undefined1  [24])*pObj & (undefined1  [24])0xf1) == (undefined1  [24])0x11) {
      pObj = (Cof_Obj_t *)((long)pObj + (ulong)(*(uint *)(pObj + 1) & 0x7fffffff) * -4);
    }
    iVar1 = Cof_ManSuppSize_rec(p,pObj);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Cof_ManSuppSize( Cof_Man_t * p, Cof_Obj_t ** ppObjs, int nObjs )
{
    int i, Counter = 0; 
    Cof_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        if ( Cof_ObjIsCo(ppObjs[i]) )
            Counter += Cof_ManSuppSize_rec( p, Cof_ObjFanin(ppObjs[i],0) );
        else
            Counter += Cof_ManSuppSize_rec( p, ppObjs[i] );
    return Counter;
}